

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O3

void __thiscall
nestl::impl::vector<int,_nestl::test::allocator_with_state<int>_>::
grow<nestl::has_exceptions::exception_ptr_error>
          (vector<int,_nestl::test::allocator_with_state<int>_> *this,exception_ptr_error *err,
          size_type requiredCapacity)

{
  int *p;
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ulong uVar4;
  int *piVar5;
  ulong n;
  
  uVar4 = (long)this->m_end_of_storage - (long)this->m_start >> 2;
  n = uVar4 * 3 + 3 >> 1;
  if (n <= requiredCapacity) {
    n = requiredCapacity;
  }
  if (n <= uVar4) {
    __assert_fail("newCapacity > capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x328,
                  "void nestl::impl::vector<int, nestl::test::allocator_with_state<int>>::grow(OperationError &, size_type) [T = int, Allocator = nestl::test::allocator_with_state<int>, OperationError = nestl::has_exceptions::exception_ptr_error]"
                 );
  }
  piVar2 = test::allocator_with_state<int>::allocate<nestl::has_exceptions::exception_ptr_error>
                     (&this->m_allocator,err,n,(void *)0x0);
  if ((err->m_exception)._M_exception_object != (void *)0x0) {
    return;
  }
  piVar1 = this->m_finish;
  p = this->m_start;
  piVar5 = piVar2;
  for (piVar3 = p; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    *piVar5 = *piVar3;
    piVar5 = piVar5 + 1;
  }
  test::allocator_with_state<int>::deallocate
            (&this->m_allocator,p,(long)this->m_end_of_storage - (long)p >> 2);
  this->m_start = piVar2;
  this->m_finish = (pointer)(((long)piVar1 - (long)p) + (long)piVar2);
  this->m_end_of_storage = piVar2 + n;
  test::allocator_with_state<int>::deallocate(&this->m_allocator,(int *)0x0,n);
  return;
}

Assistant:

void
vector<T, A>::grow(OperationError& err, size_type requiredCapacity) NESTL_NOEXCEPT_SPEC
{
    size_t newCapacity = (((capacity() + 1) * 3) / 2);
    if (newCapacity < requiredCapacity)
    {
        newCapacity = requiredCapacity;
    }

    /// @bug overflow error
    assert(newCapacity > capacity());

    reserve_nothrow(err, newCapacity);
}